

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall
wasm::FunctionValidator::visitArrayNewFixed(FunctionValidator *this,ArrayNewFixed *curr)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  Type local_48 [2];
  HeapType local_38;
  HeapType heapType;
  
  ValidationInfo::shouldBeTrue<wasm::ArrayNewFixed*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "array.init requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id != 1) {
    local_38 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                           super_Expression.type);
    bVar2 = HeapType::isArray(&local_38);
    bVar2 = ValidationInfo::shouldBeTrue<wasm::ArrayNewFixed*>
                      (this->info,bVar2,curr,"array.init heap type must be array",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
    if (bVar2) {
      HeapType::getArray((HeapType *)local_48);
      sVar1 = (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (sVar1 != 0) {
        uVar3 = 0;
        do {
          if ((curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar3) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          shouldBeSubType(this,(Type)((curr->values).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                      .data[uVar3]->type).id,local_48[0],(Expression *)curr,
                          "array.init value must have proper type");
          uVar3 = uVar3 + 1;
        } while (sVar1 != uVar3);
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNewFixed(ArrayNewFixed* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.init requires gc [--enable-gc]");
  if (curr->type == Type::unreachable) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(), curr, "array.init heap type must be array")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  for (auto* value : curr->values) {
    shouldBeSubType(value->type,
                    element.type,
                    curr,
                    "array.init value must have proper type");
  }
}